

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int mp_cmp(mp_int *a,mp_int *b)

{
  mp_int *in_RSI;
  mp_int *in_RDI;
  int local_4;
  
  if (in_RDI->sign == in_RSI->sign) {
    if (in_RDI->sign == 1) {
      local_4 = mp_cmp_mag(in_RSI,in_RDI);
    }
    else {
      local_4 = mp_cmp_mag(in_RDI,in_RSI);
    }
  }
  else if (in_RDI->sign == 1) {
    local_4 = -1;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int mp_cmp (mp_int * a, mp_int * b)
{
  /* compare based on sign */
  if (a->sign != b->sign) {
     if (a->sign == MP_NEG) {
        return MP_LT;
     } else {
        return MP_GT;
     }
  }
  
  /* compare digits */
  if (a->sign == MP_NEG) {
     /* if negative compare opposite direction */
     return mp_cmp_mag(b, a);
  } else {
     return mp_cmp_mag(a, b);
  }
}